

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O1

bool __thiscall
chrono::utils::ChParserOpenSim::parseForce
          (ChParserOpenSim *this,xml_node<char> *forceNode,ChSystem *system,
          shared_ptr<chrono::ChLoadContainer> *container)

{
  int iVar1;
  ChLoadContainer *pCVar2;
  _Alloc_hider _Var3;
  element_type *peVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  xml_attribute<char> *pxVar7;
  ostream *poVar8;
  xml_node<char> *pxVar9;
  undefined7 extraout_var;
  size_t sVar10;
  undefined8 uVar11;
  ChIntegrable CVar12;
  char *pcVar13;
  bool bVar14;
  double dVar15;
  bool local_181;
  string str;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  shared_ptr<chrono::ChLoadBodyForce> load;
  bool local_119;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string name;
  shared_ptr<chrono::ChBody> body;
  ChVector<double> direction;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  shared_ptr<chrono::ChLoadBase> local_78;
  ChVector<double> point;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pcVar13 = (forceNode->super_xml_base<char>).m_name;
  if (pcVar13 == (char *)0x0) {
    pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  std::__cxx11::string::string((string *)&str,pcVar13,(allocator *)local_118);
  local_118[0] = 0x20;
  _Var6 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )str._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(str._M_dataplus._M_p + str._M_string_length),
                     (_Iter_equals_val<const_char>)local_118);
  str._M_string_length = (long)_Var6._M_current - (long)str._M_dataplus._M_p;
  *_Var6._M_current = '\0';
  CVar12._vptr_ChIntegrable = (_func_int **)(local_118 + 0x10);
  local_118._0_8_ = CVar12._vptr_ChIntegrable;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"PointActuator","");
  if (str._M_string_length == local_118._8_8_) {
    if (str._M_string_length == 0) {
      bVar14 = true;
    }
    else {
      iVar5 = bcmp(str._M_dataplus._M_p,(void *)local_118._0_8_,str._M_string_length);
      bVar14 = iVar5 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  if ((_func_int **)local_118._0_8_ != CVar12._vptr_ChIntegrable) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  if (bVar14) {
    pxVar7 = rapidxml::xml_node<char>::first_attribute(forceNode,"name",0,true);
    pcVar13 = (pxVar7->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&name,pcVar13,(allocator *)&str);
    str._M_dataplus._M_p._0_1_ = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )name._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(name._M_dataplus._M_p + name._M_string_length),
                       (_Iter_equals_val<const_char>)&str);
    name._M_string_length = (long)_Var6._M_current - (long)name._M_dataplus._M_p;
    *_Var6._M_current = '\0';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Actuator ",9);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"body",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar13,(allocator *)local_118);
    local_118[0] = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)local_118);
    str._M_string_length = (long)_Var6._M_current - (long)str._M_dataplus._M_p;
    *_Var6._M_current = '\0';
    ChAssembly::SearchBody((ChAssembly *)&body,(char *)&system->assembly);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"point",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    strToChVector<double>(&point,pcVar13);
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"point_is_global",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    bVar14 = CStrToBool(pcVar13);
    CVar12._vptr_ChIntegrable = (_func_int **)(CONCAT71(extraout_var,bVar14) & 0xffffffff);
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"direction",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    strToChVector<double>(&direction,pcVar13);
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"force_is_global",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    bVar14 = CStrToBool(pcVar13);
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"optimal_force",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar13,(allocator *)local_118);
    local_118[0] = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)local_118);
    _Var3 = str._M_dataplus;
    str._M_string_length = (long)_Var6._M_current - (long)str._M_dataplus._M_p;
    *_Var6._M_current = '\0';
    forceNode = (xml_node<char> *)__errno_location();
    iVar5 = *(int *)&(forceNode->super_xml_base<char>).m_name;
    *(int *)&(forceNode->super_xml_base<char>).m_name = 0;
    system = (ChSystem *)local_118;
    dVar15 = strtod(_Var3._M_p,(char **)system);
    if ((pointer)local_118._0_8_ == _Var3._M_p) {
      std::__throw_invalid_argument("stod");
      goto LAB_0095967f;
    }
    iVar1 = *(int *)&(forceNode->super_xml_base<char>).m_name;
    if (iVar1 == 0) {
      *(int *)&(forceNode->super_xml_base<char>).m_name = iVar5;
    }
    else if (iVar1 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_00958d25;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    str._M_dataplus._M_p = (pointer)(dVar15 * direction.m_data[0]);
    str._M_string_length = (size_type)(dVar15 * direction.m_data[1]);
    str.field_2._M_allocated_capacity = (size_type)(dVar15 * direction.m_data[2]);
    local_181 = !bVar14;
    local_119 = (bool)((byte)CVar12._vptr_ChIntegrable ^ 1);
    load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChLoadBodyForce,std::allocator<chrono::ChLoadBodyForce>,std::shared_ptr<chrono::ChBody>&,chrono::ChVector<double>,bool,chrono::ChVector<double>&,bool>
              (&load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChLoadBodyForce **)&load,
               (allocator<chrono::ChLoadBodyForce> *)local_118,&body,(ChVector<double> *)&str,
               &local_181,&point,&local_119);
    peVar4 = load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this->m_activate_actuators == false) {
      local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
      (local_38._M_pi)->_M_use_count = 1;
      (local_38._M_pi)->_M_weak_count = 1;
      (local_38._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
      local_40 = local_38._M_pi + 1;
      local_38._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
      local_38._M_pi[1]._M_use_count = 0;
      local_38._M_pi[1]._M_weak_count = 0;
      (peVar4->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_40;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(peVar4->m_modulation).
                  super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_38);
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
    }
    pCVar2 = (container->super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_78.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChLoadContainer::Add(pCVar2,&local_78);
    if (local_78.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"PointActuator","");
    local_f8._M_allocated_capacity =
         (size_type)
         load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8._8_8_ =
         load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chrono::utils::ChParserOpenSim::Report::ForceInfo,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
                *)&str,&name,(ForceInfo *)local_118);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,chrono::utils::ChParserOpenSim::Report::ForceInfo>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->m_report).forces,&str);
    if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_p != &local_150) {
      operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    direction.m_data[1] =
         (double)body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
    if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      direction.m_data[1] =
           (double)body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    }
  }
  else {
LAB_00958d25:
    pcVar13 = (forceNode->super_xml_base<char>).m_name;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar13,(allocator *)local_118);
    local_118[0] = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)local_118);
    str._M_string_length = (long)_Var6._M_current - (long)str._M_dataplus._M_p;
    *_Var6._M_current = '\0';
    local_118._0_8_ = CVar12._vptr_ChIntegrable;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"TorqueActuator","");
    if (str._M_string_length == local_118._8_8_) {
      if (str._M_string_length == 0) {
        bVar14 = true;
      }
      else {
        iVar5 = bcmp(str._M_dataplus._M_p,(void *)local_118._0_8_,str._M_string_length);
        bVar14 = iVar5 == 0;
      }
    }
    else {
      bVar14 = false;
    }
    if ((_func_int **)local_118._0_8_ != CVar12._vptr_ChIntegrable) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    if (!bVar14) {
LAB_00959325:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unknown actuator type: ",0x17);
      pcVar13 = (forceNode->super_xml_base<char>).m_name;
      if (pcVar13 == (char *)0x0) {
        pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      sVar10 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,sVar10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      return false;
    }
    pxVar7 = rapidxml::xml_node<char>::first_attribute(forceNode,"name",0,true);
    pcVar13 = (pxVar7->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&name,pcVar13,(allocator *)&str);
    str._M_dataplus._M_p._0_1_ = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )name._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(name._M_dataplus._M_p + name._M_string_length),
                       (_Iter_equals_val<const_char>)&str);
    name._M_string_length = (long)_Var6._M_current - (long)name._M_dataplus._M_p;
    *_Var6._M_current = '\0';
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"bodyA",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar13,(allocator *)local_118);
    local_118[0] = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)local_118);
    str._M_string_length = (long)_Var6._M_current - (long)str._M_dataplus._M_p;
    *_Var6._M_current = '\0';
    ChAssembly::SearchBody((ChAssembly *)&direction,(char *)&system->assembly);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"bodyB",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar13,(allocator *)local_118);
    local_118[0] = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)local_118);
    str._M_string_length = (long)_Var6._M_current - (long)str._M_dataplus._M_p;
    *_Var6._M_current = '\0';
    ChAssembly::SearchBody((ChAssembly *)&body,(char *)&system->assembly);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"torque_is_global",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    bVar14 = CStrToBool(pcVar13);
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"axis",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    strToChVector<double>(&point,pcVar13);
    pxVar9 = rapidxml::xml_node<char>::first_node(forceNode,"optimal_force",0,true);
    pcVar13 = (pxVar9->super_xml_base<char>).m_value;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar13,(allocator *)&load);
    _Var3 = str._M_dataplus;
    forceNode = (xml_node<char> *)__errno_location();
    iVar5 = *(int *)&(forceNode->super_xml_base<char>).m_name;
    *(int *)&(forceNode->super_xml_base<char>).m_name = 0;
    dVar15 = strtod(_Var3._M_p,(char **)local_118);
    if ((pointer)local_118._0_8_ == _Var3._M_p) {
LAB_0095967f:
      uVar11 = std::__throw_invalid_argument("stod");
      if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (direction.m_data[1] != 0.0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)direction.m_data[1]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar11);
    }
    iVar1 = *(int *)&(forceNode->super_xml_base<char>).m_name;
    if (iVar1 == 0) {
      *(int *)&(forceNode->super_xml_base<char>).m_name = iVar5;
    }
    else if (iVar1 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_00959325;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    str._M_dataplus._M_p = (pointer)(dVar15 * point.m_data[0]);
    str._M_string_length = (size_type)(dVar15 * point.m_data[1]);
    str.field_2._M_allocated_capacity = (size_type)(dVar15 * point.m_data[2]);
    local_181 = !bVar14;
    load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChLoadBodyBodyTorque,std::allocator<chrono::ChLoadBodyBodyTorque>,std::shared_ptr<chrono::ChBody>&,std::shared_ptr<chrono::ChBody>&,chrono::ChVector<double>,bool>
              (&load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChLoadBodyBodyTorque **)&load,
               (allocator<chrono::ChLoadBodyBodyTorque> *)local_118,&body,
               (shared_ptr<chrono::ChBody> *)&direction,(ChVector<double> *)&str,&local_181);
    peVar4 = load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this->m_activate_actuators == false) {
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
      (local_48._M_pi)->_M_use_count = 1;
      (local_48._M_pi)->_M_weak_count = 1;
      (local_48._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
      local_48._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
      local_48._M_pi[1]._M_use_count = 0;
      local_48._M_pi[1]._M_weak_count = 0;
      peVar4[5].super_ChLoadCustom.loadable.
      super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_48._M_pi + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&peVar4[5].super_ChLoadCustom.load_Q,
                 &local_48);
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
    }
    pCVar2 = (container->super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_88._M_allocated_capacity =
         (size_type)
         load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88._8_8_ =
         load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChLoadContainer::Add(pCVar2,(shared_ptr<chrono::ChLoadBase> *)&local_88);
    if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    local_118._0_8_ = CVar12._vptr_ChIntegrable;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"TorqueActuator","");
    local_f8._M_allocated_capacity =
         (size_type)
         load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8._8_8_ =
         load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chrono::utils::ChParserOpenSim::Report::ForceInfo,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
                *)&str,&name,(ForceInfo *)local_118);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,chrono::utils::ChParserOpenSim::Report::ForceInfo>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->m_report).forces,&str);
    if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_p != &local_150) {
      operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    if ((_func_int **)local_118._0_8_ != CVar12._vptr_ChIntegrable) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)direction.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)direction.m_data[1]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ChParserOpenSim::parseForce(rapidxml::xml_node<>* forceNode,
                                 ChSystem& system,
                                 std::shared_ptr<ChLoadContainer> container) {
    if (stringStripCStr(forceNode->name()) == std::string("PointActuator")) {
        std::string name = stringStripCStr(forceNode->first_attribute("name")->value());
        std::cout << "Actuator " << name << std::endl;
        // Chrono should be using std::string
        auto body = system.SearchBody(stringStripCStr(forceNode->first_node("body")->value()).c_str());
        ChVector<> point = strToChVector<double>(forceNode->first_node("point")->value());
        auto point_global = CStrToBool(forceNode->first_node("point_is_global")->value());
        ChVector<> direction = strToChVector<double>(forceNode->first_node("direction")->value());
        auto force_global = CStrToBool(forceNode->first_node("force_is_global")->value());
        auto max_force = std::stod(stringStripCStr(forceNode->first_node("optimal_force")->value()));

        auto load = chrono_types::make_shared<ChLoadBodyForce>(body, max_force * direction, !force_global, point, !point_global);
        if (!m_activate_actuators)
            load->SetModulationFunction(chrono_types::make_shared<ChFunction_Const>(0));
        container->Add(load);

        m_report.forces.insert(std::make_pair(name, Report::ForceInfo{std::string("PointActuator"), load}));

        return true;
    } else if (stringStripCStr(forceNode->name()) == std::string("TorqueActuator")) {
        std::string name = stringStripCStr(forceNode->first_attribute("name")->value());
        auto bodyA = system.SearchBody(stringStripCStr(forceNode->first_node("bodyA")->value()).c_str());
        auto bodyB = system.SearchBody(stringStripCStr(forceNode->first_node("bodyB")->value()).c_str());
        auto torque_is_global = CStrToBool(forceNode->first_node("torque_is_global")->value());
        ChVector<> axis = strToChVector<double>(forceNode->first_node("axis")->value());
        auto max_force = std::stod(forceNode->first_node("optimal_force")->value());

        // Note: OpenSim assumes the specified torque is applied to bodyA (with an equal and opposite
        // torque applied to bodyB).  In ChLoadBodyBodyTorque, the torque is applied to the 2nd body
        // passed in its constructor.
        auto load = chrono_types::make_shared<ChLoadBodyBodyTorque>(bodyB, bodyA, max_force * axis, !torque_is_global);
        if (!m_activate_actuators)
            load->SetModulationFunction(chrono_types::make_shared<ChFunction_Const>(0));
        container->Add(load);

        m_report.forces.insert(std::make_pair(name, Report::ForceInfo{std::string("TorqueActuator"), load}));

        return true;
    }

    std::cout << "Unknown actuator type: " << forceNode->name() << std::endl;
    return false;
}